

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void deqp::gls::calcShaderColorCoord<unsigned_int>
               (Vec2 *coord,Vec3 *color,Vector<unsigned_int,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  uint uVar1;
  int i;
  long lVar2;
  undefined7 in_register_00000009;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  Vector<float,_3> res;
  
  dVar8 = (double)DAT_01a9b070;
  dVar10 = DAT_01a9b070._8_8_;
  if ((int)CONCAT71(in_register_00000009,isCoordinate) == 0) {
    switch(numComponents + -1) {
    case 0:
      uVar1 = attribValue->m_data[0];
      res.m_data[2] = 0.0;
      res.m_data[0] = 0.0;
      res.m_data[1] = 0.0;
      lVar2 = 0;
      do {
        res.m_data[lVar2] = color->m_data[lVar2] * (float)uVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      color->m_data[2] = res.m_data[2];
      *(undefined8 *)color->m_data = res.m_data._0_8_;
      return;
    case 1:
      auVar7._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar7._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar7._12_4_ = 0;
      *(ulong *)color->m_data =
           CONCAT44((float)(SUB168(auVar7 | _DAT_01a9b070,8) - dVar10) *
                    (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    (float)(SUB168(auVar7 | _DAT_01a9b070,0) - dVar8) *
                    (float)*(undefined8 *)color->m_data);
      return;
    case 2:
      auVar6._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar6._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar6._12_4_ = 0;
      *(ulong *)color->m_data =
           CONCAT44((float)(SUB168(auVar6 | _DAT_01a9b070,8) - dVar10) *
                    (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    (float)(SUB168(auVar6 | _DAT_01a9b070,0) - dVar8) *
                    (float)*(undefined8 *)color->m_data);
      color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2];
      return;
    case 3:
      fVar3 = (float)attribValue->m_data[3];
      auVar9._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar9._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar9._12_4_ = 0;
      *(ulong *)color->m_data =
           CONCAT44(fVar3 * (float)(SUB168(auVar9 | _DAT_01a9b070,8) - dVar10) *
                            (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    fVar3 * (float)(SUB168(auVar9 | _DAT_01a9b070,0) - dVar8) *
                            (float)*(undefined8 *)color->m_data);
      color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2] * fVar3;
    }
  }
  else {
    switch(numComponents + -1) {
    case 0:
      uVar1 = attribValue->m_data[0];
      coord->m_data[0] = (float)uVar1;
      coord->m_data[1] = (float)uVar1;
      return;
    case 1:
      auVar5._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar5._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar5._12_4_ = 0;
      *(ulong *)coord->m_data =
           CONCAT44((float)(SUB168(auVar5 | _DAT_01a9b070,8) - dVar10),
                    (float)(SUB168(auVar5 | _DAT_01a9b070,0) - dVar8));
      return;
    case 2:
      uVar1 = attribValue->m_data[1];
      coord->m_data[0] = (float)attribValue->m_data[2] + (float)attribValue->m_data[0];
      coord->m_data[1] = (float)uVar1;
      return;
    case 3:
      auVar4._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar4._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar4._12_4_ = 0;
      auVar11._0_8_ = *(ulong *)(attribValue->m_data + 2) & 0xffffffff;
      auVar11._8_4_ = (int)(*(ulong *)(attribValue->m_data + 2) >> 0x20);
      auVar11._12_4_ = 0;
      *(ulong *)coord->m_data =
           CONCAT44((float)(SUB168(auVar11 | _DAT_01a9b070,8) - dVar10) +
                    (float)(SUB168(auVar4 | _DAT_01a9b070,8) - dVar10),
                    (float)(SUB168(auVar11 | _DAT_01a9b070,0) - dVar8) +
                    (float)(SUB168(auVar4 | _DAT_01a9b070,0) - dVar8));
      return;
    }
  }
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}